

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2bd0f2::dummy::~dummy(dummy *this)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->alive == true) {
    this->alive = false;
    (anonymous_namespace)::dummy::instances_count =
         (anonymous_namespace)::dummy::instances_count + -1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,anon_var_dwarf_2bde05,anon_var_dwarf_2bde05 + 0x26);
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

~dummy () noexcept(false)
        {
            if (alive)
            {
                alive = false;
            }
            else
            {
                throw std::runtime_error(u8"Двойное уничтожение!"_u8s);
            }
            --instances_count;
        }